

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O1

float OpenMD::lexi_cast<float>(string *str)

{
  istream *piVar1;
  float result;
  istringstream iss;
  float local_18c;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)str,_S_in);
  piVar1 = std::istream::_M_extract<float>((float *)local_188);
  if (((&piVar1->field_0x20)[(long)piVar1->_vptr_basic_istream[-3]] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"lexi_cast Error",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return local_18c;
}

Assistant:

T lexi_cast(const std::string& str) {
    T result;
    std::istringstream iss(str);
    if (!(iss >> result)) { std::cerr << "lexi_cast Error" << std::endl; }
    return result;
  }